

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O3

void __thiscall CEDate::init_members(CEDate *this)

{
  allocator<double> local_39;
  value_type_conflict1 local_38;
  vector<double,_std::allocator<double>_> local_30;
  
  local_38 = 0.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector(&local_30,4,&local_38,&local_39);
  std::vector<double,_std::allocator<double>_>::operator=(&this->gregorian_date_vect_,&local_30);
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_39);
  this->return_type_ = JD;
  this->julian_date_ = 0.0;
  this->mod_julian_date_ = 0.0;
  this->gregorian_date_ = 0.0;
  return;
}

Assistant:

void CEDate::init_members(void)
{
    gregorian_date_vect_ = std::vector<double>(4, 0.0);
    julian_date_         = 0.0;
    mod_julian_date_     = 0.0;
    gregorian_date_      = 0.0;
    return_type_         = CEDateType::JD ;
}